

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool __thiscall
dg::vr::RelationsAnalyzer::mayHaveAlias(RelationsAnalyzer *this,ValueRelations *graph,V val)

{
  bool bVar1;
  V from;
  pointer ppVVar2;
  bool bVar3;
  VectorSet<const_llvm::Value_*> local_48;
  
  ValueRelations::getEqual(&local_48,graph,val);
  ppVVar2 = local_48.vec.
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    from = *local_48.vec.
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    bVar1 = hasKnownOrigin(graph,from);
    if (bVar1) {
      do {
        ppVVar2 = ppVVar2 + 1;
        bVar1 = mayHaveAlias(this,from);
        if ((bVar1) ||
           (bVar3 = ppVVar2 !=
                    local_48.vec.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
           ppVVar2 ==
           local_48.vec.
           super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
           super__Vector_impl_data._M_finish)) break;
        from = *ppVVar2;
        bVar1 = hasKnownOrigin(graph,from);
      } while (bVar1);
    }
  }
  if (local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.vec.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool RelationsAnalyzer::mayHaveAlias(const ValueRelations &graph, V val) const {
    for (const auto *eqval : graph.getEqual(val)) {
        if (!hasKnownOrigin(graph, eqval) || mayHaveAlias(eqval))
            return true;
    }
    return false;
}